

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

_Bool reed_solomon_factorize_error_locator
                (field_t field,uint num_skip,polynomial_t locator_log,field_element_t *roots,
                field_logarithm_t **element_exp)

{
  field_element_t fVar1;
  uint uVar2;
  field_operation_t i;
  long lVar3;
  polynomial_t poly_log;
  
  memset(roots + num_skip,0,(ulong)locator_log.order);
  uVar2 = num_skip;
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    poly_log._8_8_ = locator_log._8_8_ & 0xffffffff;
    poly_log.coeff = locator_log.coeff;
    fVar1 = polynomial_eval_log_lut(field,poly_log,element_exp[lVar3]);
    if (fVar1 == '\0') {
      roots[uVar2] = (field_element_t)lVar3;
      uVar2 = uVar2 + 1;
    }
  }
  return uVar2 == locator_log.order + num_skip;
}

Assistant:

bool reed_solomon_factorize_error_locator(field_t field, unsigned int num_skip, polynomial_t locator_log, field_element_t *roots,
                                          field_logarithm_t **element_exp) {
    // normally it'd be tricky to find all the roots
    // but, the finite field is awfully finite...
    // just brute force search across every field element
    unsigned int root = num_skip;
    memset(roots + num_skip, 0, (locator_log.order) * sizeof(field_element_t));
    for (field_operation_t i = 0; i < 256; i++) {
        // we make two optimizations here to help this search go faster
        // a) we have precomputed the first successive powers of every single element
        //   in the field. we need at most n powers, where n is the largest possible
        //   degree of the error locator
        // b) we have precomputed the error locator polynomial in log form, which
        //   helps reduce some lookups that would be done here
        if (!polynomial_eval_log_lut(field, locator_log, element_exp[i])) {
            roots[root] = (field_element_t)i;
            root++;
        }
    }
    // this is where we find out if we are have too many errors to recover from
    // berlekamp-massey may have built an error locator that has 0 discrepancy
    // on the syndromes but doesn't have enough roots
    return root == locator_log.order + num_skip;
}